

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * Json::valueToString_abi_cxx11_(LargestUInt value)

{
  char *pcVar1;
  LargestUInt in_RSI;
  string *in_RDI;
  char *current;
  UIntToStringBuffer buffer;
  allocator local_41;
  char *local_40;
  char local_38 [25];
  char acStack_1f [31];
  
  local_40 = acStack_1f;
  uintToString(in_RSI,&local_40);
  pcVar1 = local_40;
  if (local_38 <= local_40) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    return in_RDI;
  }
  __assert_fail("current >= buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_writer.cpp"
                ,0x54,"std::string Json::valueToString(LargestUInt)");
}

Assistant:

std::string valueToString(LargestUInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  uintToString(value, current);
  assert(current >= buffer);
  return current;
}